

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O3

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul>,Fixpp::FieldRef<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<430u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<63u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<64u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<1u,Fixpp::Type::String>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
                  *v)

{
  *(char **)this =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 8) =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x10) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x18) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x20) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x28) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x30) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x38) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x40) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x48) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x50) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x58) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x60) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x68) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL>,_Fixpp::FieldRef<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<430U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<63U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<64U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<1U,_Fixpp::Type::String>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }